

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.cxx
# Opt level: O0

string * __thiscall
FileParse::formatDouble_abi_cxx11_
          (string *__return_storage_ptr__,FileParse *this,double value,int precision,
          double scientificLowerBound,double scientificUpperBound)

{
  bool useScientific_00;
  size_type sVar1;
  fmtflags __fmtfl;
  string *psVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  long local_1b0;
  ostringstream tempStream;
  bool useScientific;
  double scientificUpperBound_local;
  double scientificLowerBound_local;
  int precision_local;
  double value_local;
  string *str;
  
  psVar2 = __return_storage_ptr__;
  std::abs((int)__return_storage_ptr__);
  if (scientificLowerBound <= extraout_XMM0_Qa) {
    std::abs((int)psVar2);
    useScientific_00 = false;
    if (extraout_XMM0_Qa_00 <= scientificUpperBound) goto LAB_00233dcd;
  }
  useScientific_00 = value != 0.0;
LAB_00233dcd:
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
  __fmtfl = _S_fixed;
  if (useScientific_00) {
    __fmtfl = _S_scientific;
  }
  std::ios_base::setf((ios_base *)((long)&local_1b0 + *(long *)(local_1b0 + -0x18)),__fmtfl,
                      _S_floatfield);
  std::ios_base::precision
            ((ios_base *)((long)&local_1b0 + *(long *)(local_1b0 + -0x18)),(long)(int)this);
  std::ostream::operator<<(&local_1b0,value);
  std::__cxx11::ostringstream::str();
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (__return_storage_ptr__,'.',0);
  if (sVar1 != 0xffffffffffffffff) {
    trimTrailingZeros(__return_storage_ptr__,useScientific_00);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string formatDouble(double value,
                      int precision,
                      double scientificLowerBound,
                      double scientificUpperBound)
    {
        bool useScientific = (std::abs(value) < scientificLowerBound || std::abs(value) > scientificUpperBound)
                             && value != 0.0;

        std::ostringstream tempStream;
        tempStream.setf(useScientific ? std::ios::scientific : std::ios::fixed, std::ios::floatfield);
        tempStream.precision(precision);
        tempStream << value;

        std::string str = tempStream.str();  // Get the formatted string

        // Trim trailing zeros if there is a decimal point in the string
        if (str.find('.') != std::string::npos)
        {
            trimTrailingZeros(str, useScientific);
        }

        return str;  // Return the final formatted string
    }